

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler_test.cc
# Opt level: O2

void ADTestTest(int n)

{
  tuple<double_*,_std::default_delete<double[]>_> random_sample_00;
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string local_60;
  double local_40;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> local_38;
  unique_ptr<double[],_std::default_delete<double[]>_> random_sample;
  
  uVar3 = 0;
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  uVar4 = 0;
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
  }
  random_sample_00.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)operator_new__(uVar2);
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    *(double *)
     ((long)random_sample_00.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
            super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar3 * 8) =
         ((double)(int)uVar3 + 0.01) / (double)n;
  }
  local_38._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (tuple<double_*,_std::default_delete<double[]>_>)
       (tuple<double_*,_std::default_delete<double[]>_>)
       random_sample_00.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  std::__sort<double*,__gnu_cxx::__ops::_Iter_less_iter>
            (random_sample_00.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,
             (double *)
             ((long)random_sample_00.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl + (long)n * 8));
  local_40 = AndersonDarlingStatistic
                       (n,(double *)
                          random_sample_00.
                          super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                          super__Head_base<0UL,_double_*,_false>._M_head_impl);
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  StringPrintf_abi_cxx11_(&local_60,"Testing the AD test. n=%d, ad_stat = %f",local_40,n);
  std::operator<<(poVar1,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_38);
  return;
}

Assistant:

void ADTestTest(int n) {
  std::unique_ptr<double[]> random_sample(new double[n]);
  for (int i = 0; i < n; i++) {
    random_sample[i] = (i+0.01)/n;
  }
  std::sort(random_sample.get(), random_sample.get() + n);
  double ad_stat = AndersonDarlingStatistic(n, random_sample.get());
  LOG(INFO) << StringPrintf("Testing the AD test. n=%d, ad_stat = %f",
                            n, ad_stat);
}